

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O0

void __thiscall QWizardPrivate::updatePixmap(QWizardPrivate *this,WizardPixmap which)

{
  int in_ESI;
  QWizardPrivate *in_RDI;
  QWizard *q;
  QWizardPrivate *in_stack_00000040;
  QWidget *in_stack_ffffffffffffffd8;
  
  q_func(in_RDI);
  if (in_ESI == 3) {
    if (in_RDI->wizStyle == MacStyle) {
      QWidget::update(in_stack_ffffffffffffffd8);
      QWidget::updateGeometry((QWidget *)in_RDI);
    }
  }
  else {
    updateLayout(in_stack_00000040);
  }
  return;
}

Assistant:

void QWizardPrivate::updatePixmap(QWizard::WizardPixmap which)
{
    Q_Q(QWizard);
    if (which == QWizard::BackgroundPixmap) {
        if (wizStyle == QWizard::MacStyle) {
            q->update();
            q->updateGeometry();
        }
    } else {
        updateLayout();
    }
}